

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamAttributes::append
          (QXmlStreamAttributes *this,QString *namespaceUri,QString *name,QString *value)

{
  long in_FS_OFFSET;
  QXmlStreamAttribute local_80;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamAttribute::QXmlStreamAttribute(&local_80,namespaceUri,name,value);
  QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
            ((QMovableArrayOps<QXmlStreamAttribute> *)this,
             (this->super_QList<QXmlStreamAttribute>).d.size,&local_80);
  QList<QXmlStreamAttribute>::end(&this->super_QList<QXmlStreamAttribute>);
  if (&(local_80.m_value.m_string.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.m_value.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.m_value.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_80.m_value.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_80.m_value.m_string.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_80.m_qualifiedName.m_string.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.m_qualifiedName.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
    ._M_i = ((local_80.m_qualifiedName.m_string.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.m_qualifiedName.m_string.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.m_qualifiedName.m_string.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_80.m_namespaceUri.m_string.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.m_namespaceUri.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((local_80.m_namespaceUri.m_string.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.m_namespaceUri.m_string.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.m_namespaceUri.m_string.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_80.m_name.m_string.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.m_name.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.m_name.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_80.m_name.m_string.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_80.m_name.m_string.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamAttributes::append(const QString &namespaceUri, const QString &name, const QString &value)
{
    append(QXmlStreamAttribute(namespaceUri, name, value));
}